

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall
dgrminer::PartialUnion::appendToEncodingLabel(PartialUnion *this,int encoding,string *label)

{
  undefined1 local_38 [40];
  
  local_38._0_4_ = encoding;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)label);
  std::
  _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
            ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
              *)&this->encodingLabel,
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void PartialUnion::appendToEncodingLabel(int encoding, string label)
	{
		encodingLabel.insert(std::make_pair(encoding, label));
	}